

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O2

void __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>>::X<Fad<double>>
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>> *this,TPZFMatrix<double> *coord,
          TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *result)

{
  int i;
  long lVar1;
  long lVar2;
  int i_1;
  undefined1 local_1a8 [24];
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>
  *pFStack_190;
  TPZVec<Fad<double>_> *local_180;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>
  local_178;
  Fad<double> norm;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> local_148;
  TPZManVector<Fad<double>,_3> xqsiLxc;
  TPZManVector<Fad<double>,_3> xqsi;
  
  xqsiLxc.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  xqsiLxc.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  xqsiLxc.super_TPZVec<Fad<double>_>.fNElements = 0;
  xqsiLxc.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  local_180 = result;
  TPZManVector<Fad<double>,_3>::TPZManVector(&xqsi,3,(Fad<double> *)&xqsiLxc);
  Fad<double>::~Fad((Fad<double> *)&xqsiLxc);
  local_1a8._0_8_ = (Fad<double> *)0x0;
  local_1a8._8_8_ = (ulong)(uint)local_1a8._12_4_ << 0x20;
  local_1a8._16_8_ = (double *)0x0;
  pFStack_190 = (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>
                 *)0x0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&xqsiLxc,3,(Fad<double> *)local_1a8);
  Fad<double>::~Fad((Fad<double> *)local_1a8);
  TPZGeoBlend<pzgeom::TPZGeoQuad>::X<Fad<double>>
            ((TPZGeoBlend<pzgeom::TPZGeoQuad> *)this,coord,loc,&xqsi.super_TPZVec<Fad<double>_>);
  norm.val_ = 0.0;
  norm.dx_.num_elts = 0;
  norm.dx_.ptr_to_data = (double *)0x0;
  norm.defaultVal = 0.0;
  lVar2 = 0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    local_1a8._0_8_ = (long)&(xqsi.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar2;
    local_1a8._8_8_ = *(double *)(*(long *)(this + 0xa90) + lVar1 * 8);
    local_1a8._16_8_ = (double *)0x0;
    Fad<double>::operator=
              ((Fad<double> *)
               (CONCAT44(xqsiLxc.super_TPZVec<Fad<double>_>.fStore._4_4_,
                         xqsiLxc.super_TPZVec<Fad<double>_>.fStore._0_4_) + lVar2),
               (FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)local_1a8);
    local_1a8._0_8_ =
         CONCAT44(xqsiLxc.super_TPZVec<Fad<double>_>.fStore._4_4_,
                  xqsiLxc.super_TPZVec<Fad<double>_>.fStore._0_4_) + lVar2;
    local_1a8._8_8_ = local_1a8._0_8_;
    Fad<double>::operator+=(&norm,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_1a8);
    lVar2 = lVar2 + 0x20;
  }
  sqrt<double>((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_1a8,&norm);
  Fad<double>::operator=(&norm,(FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_1a8);
  Fad<double>::~Fad((Fad<double> *)(local_1a8 + 8));
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    local_1a8._8_8_ = *(double *)(*(long *)(this + 0xa90) + lVar2 * 8);
    local_148.fadexpr_.left_ =
         (Fad<double> *)
         (CONCAT44(xqsiLxc.super_TPZVec<Fad<double>_>.fStore._4_4_,
                   xqsiLxc.super_TPZVec<Fad<double>_>.fStore._0_4_) + lVar1);
    local_148.fadexpr_.right_.constant_ = *(double *)(this + 0xa80);
    local_148.fadexpr_.right_.defaultVal = 0.0;
    local_1a8._16_8_ = (double *)0x0;
    local_178.fadexpr_.right_ = &norm;
    pFStack_190 = &local_178;
    local_178.fadexpr_.left_ = &local_148;
    Fad<double>::operator=
              ((Fad<double> *)((long)&local_180->fStore->val_ + lVar1),
               (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
                *)local_1a8);
    lVar1 = lVar1 + 0x20;
  }
  Fad<double>::~Fad(&norm);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&xqsiLxc);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&xqsi);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
		{
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> xqsiLxc(3,0.); // will store (x,y,z)-xc
            GeomQuad::X(coord,loc,xqsi); // gives the map (qsi,eta) to (x,y,z)
            
            T norm = 0.;
            for (int i = 0; i < 3; i++) { // Does xqsi-xc and calculates its norm
                xqsiLxc[i] = xqsi[i] - fxc[i];
                norm += xqsiLxc[i] * xqsiLxc[i];
            }
            norm = sqrt(norm);
            
            for (int i = 0; i < 3; i++) {
                result[i] = fxc[i] + xqsiLxc[i] * fR / norm;
            }
                
            
		}